

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall TiXmlDocument::TiXmlDocument(TiXmlDocument *this)

{
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = &TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = TINYXML_DOCUMENT;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDocument_00216c50;
  (this->errorDesc).rep_ = &TiXmlString::nullrep_;
  (this->errorLocation).col = -1;
  this->tabsize = 4;
  (this->errorLocation).row = -1;
  this->useMicrosoftBOM = false;
  this->error = false;
  this->errorId = 0;
  TiXmlString::assign(&this->errorDesc,"",0);
  (this->errorLocation).row = 0;
  (this->errorLocation).col = 0;
  return;
}

Assistant:

TiXmlDocument::TiXmlDocument() : TiXmlNode( TiXmlNode::TINYXML_DOCUMENT )
{
	tabsize = 4;
	useMicrosoftBOM = false;
	ClearError();
}